

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serialize.cpp
# Opt level: O1

void __thiscall
chatra::Reader::parse
          (Reader *this,uint expectedVersion,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *bytes)

{
  pointer *__return_storage_ptr__;
  uint uVar1;
  unsigned_long uVar2;
  undefined8 *puVar3;
  fd_set *__writefds;
  fd_set *__readfds;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  fd_set *in_R8;
  timeval *in_R9;
  void *local_70;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> chunk;
  
  this->buffer = bytes;
  this->offset = 0;
  uVar1 = readRawInteger<unsigned_int>(this);
  if (uVar1 == expectedVersion) {
    __writefds = (fd_set *)
                 ((this->buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_finish +
                 -(long)(this->buffer->
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                        super__Vector_impl_data._M_start);
    if ((fd_set *)this->offset < __writefds) {
      __return_storage_ptr__ =
           &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
      do {
        read<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,this);
        uVar2 = readRawInteger<unsigned_long>(this);
        __first._M_current =
             (this->buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
             _M_impl.super__Vector_impl_data._M_start + this->offset;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_70,__first,
                   (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )(__first._M_current + uVar2),
                   (allocator_type *)(chunk.field_2._M_local_buf + 0xf));
        this->offset = this->offset + uVar2;
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<std::__cxx11::string,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&this->chunks,__return_storage_ptr__,
                   (vector<unsigned_char,std::allocator<unsigned_char>> *)&local_70);
        if (local_70 != (void *)0x0) {
          operator_delete(local_70);
        }
        if ((size_type *)
            data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage != &chunk._M_string_length) {
          operator_delete(data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        __writefds = (fd_set *)
                     ((this->buffer->
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                      super__Vector_impl_data._M_finish +
                     -(long)(this->buffer->
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                            _M_impl.super__Vector_impl_data._M_start);
      } while ((fd_set *)this->offset < __writefds);
    }
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)&chunk._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,"");
    select(this,(int)&data + 0x10,__readfds,__writefds,in_R8,in_R9);
    if ((size_type *)
        data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage != &chunk._M_string_length) {
      operator_delete(data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage);
    }
    return;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(0x28);
  *puVar3 = 0;
  puVar3[1] = 0;
  puVar3[2] = 0;
  puVar3[3] = 0;
  puVar3[4] = 0;
  puVar3[1] = puVar3 + 3;
  puVar3[2] = 0;
  *(undefined1 *)(puVar3 + 3) = 0;
  *puVar3 = &PTR__NativeException_00245b18;
  __cxa_throw(puVar3,&IllegalArgumentException::typeinfo,NativeException::~NativeException);
}

Assistant:

void Reader::parse(unsigned expectedVersion, const std::vector<uint8_t>& bytes) {
	buffer = &bytes;
	offset = 0;

	if (read<unsigned>() != expectedVersion)
		throw IllegalArgumentException();

	while (offset < buffer->size()) {
		auto chunk = read<std::string>();
		auto chunkSize = read<size_t>();
		std::vector<uint8_t> data(buffer->cbegin() + offset, buffer->cbegin() + offset + chunkSize);
		offset += chunkSize;
		chunks.emplace(std::move(chunk), std::move(data));
	}

	select("");
}